

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O3

void __thiscall Car::add_node(Car *this,Node *a,double **matrix)

{
  pointer *ppNVar1;
  iterator __position;
  undefined3 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  __position._M_current =
       (this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_start != __position._M_current) {
    this->now_time =
         (int)matrix[this->now_idx][a->idx] / this->car_speed + this->now_time + a->unload_time;
  }
  if (__position._M_current ==
      (this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Node,std::allocator<Node>>::_M_realloc_insert<Node_const&>
              ((vector<Node,std::allocator<Node>> *)&this->tour,__position,a);
  }
  else {
    iVar6 = a->x;
    iVar7 = a->y;
    iVar8 = a->idx;
    iVar9 = a->demand;
    uVar2 = *(undefined3 *)&a->field_0x11;
    iVar3 = a->tw_open;
    iVar4 = a->tw_close;
    iVar5 = a->unload_time;
    (__position._M_current)->visited = a->visited;
    *(undefined3 *)&(__position._M_current)->field_0x11 = uVar2;
    (__position._M_current)->tw_open = iVar3;
    (__position._M_current)->tw_close = iVar4;
    (__position._M_current)->unload_time = iVar5;
    (__position._M_current)->x = iVar6;
    (__position._M_current)->y = iVar7;
    (__position._M_current)->idx = iVar8;
    (__position._M_current)->demand = iVar9;
    ppNVar1 = &(this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  this->now_load = this->now_load + a->demand;
  this->now_idx = a->idx;
  a->visited = true;
  return;
}

Assistant:

void Car::add_node(Node *a, double** matrix)
{
	if(!tour.empty()){// though the tour first adds the depot, it doesnt count time 
		now_time += (int)matrix[now_idx][a->idx] / car_speed;
		now_time += a->unload_time;	
	}
	tour.push_back(*a);
	now_load += a->demand;
	now_idx = a->idx;
	a->visited = true;
}